

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::FeatureType::MergeFrom(FeatureType *this,FeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  ArrayFeatureType *this_00;
  StringFeatureType *this_01;
  ImageFeatureType *this_02;
  Int64FeatureType *this_03;
  DoubleFeatureType *this_04;
  DictionaryFeatureType *this_05;
  SequenceFeatureType *this_06;
  ArrayFeatureType *from_00;
  StringFeatureType *from_01;
  ImageFeatureType *from_02;
  Int64FeatureType *from_03;
  DoubleFeatureType *from_04;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *from_06;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0x129c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->isoptional_ == true) {
    this->isoptional_ = true;
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_04 = (this->Type_).doubletype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 2;
      this_04 = (DoubleFeatureType *)operator_new(0x18);
      DoubleFeatureType::DoubleFeatureType(this_04);
      (this->Type_).doubletype_ = this_04;
      if (from->_oneof_case_[0] != 2) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_04 = (DoubleFeatureType *)&_DoubleFeatureType_default_instance_;
        goto LAB_001cbce7;
      }
    }
    from_04 = (from->Type_).doubletype_;
LAB_001cbce7:
    DoubleFeatureType::MergeFrom(this_04,from_04);
    return;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_01 = (this->Type_).stringtype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 3;
      this_01 = (StringFeatureType *)operator_new(0x18);
      StringFeatureType::StringFeatureType(this_01);
      (this->Type_).stringtype_ = this_01;
      if (from->_oneof_case_[0] != 3) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_01 = (StringFeatureType *)&_StringFeatureType_default_instance_;
        goto LAB_001cbca5;
      }
    }
    from_01 = (from->Type_).stringtype_;
LAB_001cbca5:
    StringFeatureType::MergeFrom(this_01,from_01);
    return;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_02 = (this->Type_).imagetype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 4;
      this_02 = (ImageFeatureType *)operator_new(0x38);
      ImageFeatureType::ImageFeatureType(this_02);
      (this->Type_).imagetype_ = this_02;
      if (from->_oneof_case_[0] != 4) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_02 = (ImageFeatureType *)&_ImageFeatureType_default_instance_;
        goto LAB_001cbcbb;
      }
    }
    from_02 = (from->Type_).imagetype_;
LAB_001cbcbb:
    ImageFeatureType::MergeFrom(this_02,from_02);
    return;
  case 5:
    if (this->_oneof_case_[0] == 5) {
      this_00 = (this->Type_).multiarraytype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 5;
      this_00 = (ArrayFeatureType *)operator_new(0x48);
      ArrayFeatureType::ArrayFeatureType(this_00);
      (this->Type_).multiarraytype_ = this_00;
      if (from->_oneof_case_[0] != 5) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_00 = (ArrayFeatureType *)&_ArrayFeatureType_default_instance_;
        goto LAB_001cbc8c;
      }
    }
    from_00 = (from->Type_).multiarraytype_;
LAB_001cbc8c:
    ArrayFeatureType::MergeFrom(this_00,from_00);
    return;
  case 6:
    if (this->_oneof_case_[0] == 6) {
      this_05 = (this->Type_).dictionarytype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 6;
      this_05 = (DictionaryFeatureType *)operator_new(0x20);
      DictionaryFeatureType::DictionaryFeatureType(this_05);
      (this->Type_).dictionarytype_ = this_05;
      if (from->_oneof_case_[0] != 6) {
        protobuf_FeatureTypes_2eproto::InitDefaults();
        from_05 = (DictionaryFeatureType *)&_DictionaryFeatureType_default_instance_;
        goto LAB_001cbcfd;
      }
    }
    from_05 = (from->Type_).dictionarytype_;
LAB_001cbcfd:
    DictionaryFeatureType::MergeFrom(this_05,from_05);
    return;
  case 7:
    if (this->_oneof_case_[0] == 7) {
      this_06 = (this->Type_).sequencetype_;
LAB_001cbc77:
      from_06 = (from->Type_).sequencetype_;
    }
    else {
      clear_Type(this);
      this->_oneof_case_[0] = 7;
      this_06 = (SequenceFeatureType *)operator_new(0x28);
      SequenceFeatureType::SequenceFeatureType(this_06);
      (this->Type_).sequencetype_ = this_06;
      if (from->_oneof_case_[0] == 7) goto LAB_001cbc77;
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_06 = (SequenceFeatureType *)&_SequenceFeatureType_default_instance_;
    }
    SequenceFeatureType::MergeFrom(this_06,from_06);
  default:
    goto switchD_001cba52_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_03 = (this->Type_).int64type_;
LAB_001cbbc3:
    from_03 = (from->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 1;
    this_03 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_03);
    (this->Type_).int64type_ = this_03;
    if (from->_oneof_case_[0] == 1) goto LAB_001cbbc3;
    protobuf_FeatureTypes_2eproto::InitDefaults();
    from_03 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
  }
  Int64FeatureType::MergeFrom(this_03,from_03);
switchD_001cba52_default:
  return;
}

Assistant:

void FeatureType::MergeFrom(const FeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.isoptional() != 0) {
    set_isoptional(from.isoptional());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}